

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional.cpp
# Opt level: O0

Data * DL::Expressions::and_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  VM *this;
  VM *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference d_00;
  allocator local_101;
  string local_100 [35];
  undefined1 local_dd;
  int local_dc;
  undefined1 local_d8 [8];
  Data e;
  Data *d;
  const_iterator __end4;
  const_iterator __begin4;
  vector_t<Data> *__range4;
  bool b;
  allocator local_41;
  string local_40 [32];
  VM *local_20;
  VM *vm_local;
  vector_t<Data> *args_local;
  Data *r;
  
  local_20 = vm;
  vm_local = (VM *)args;
  args_local = (vector_t<Data> *)__return_storage_ptr__;
  sVar2 = std::vector<DL::Data,_std::allocator<DL::Data>_>::size(args);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    Data::Data(__return_storage_ptr__,(string_t *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    sVar2 = std::vector<DL::Data,_std::allocator<DL::Data>_>::size
                      ((vector<DL::Data,_std::allocator<DL::Data>_> *)vm_local);
    this_00 = vm_local;
    this = local_20;
    if (sVar2 == 1) {
      d_00 = std::vector<DL::Data,_std::allocator<DL::Data>_>::front
                       ((vector<DL::Data,_std::allocator<DL::Data>_> *)vm_local);
      VM::castTo(__return_storage_ptr__,this,d_00,DT_Bool,false);
    }
    else {
      __range4._3_1_ = true;
      __end4 = std::vector<DL::Data,_std::allocator<DL::Data>_>::begin
                         ((vector<DL::Data,_std::allocator<DL::Data>_> *)vm_local);
      d = (Data *)std::vector<DL::Data,_std::allocator<DL::Data>_>::end
                            ((vector<DL::Data,_std::allocator<DL::Data>_> *)this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                                         *)&d), bVar1) {
        e._88_8_ = __gnu_cxx::
                   __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                   ::operator*(&__end4);
        VM::castTo((Data *)local_d8,local_20,(Data *)e._88_8_,DT_Bool,false);
        bVar1 = Data::isValid((Data *)local_d8);
        if ((bVar1) && (bVar1 = Data::getBool((Data *)local_d8), bVar1)) {
          local_dc = 0;
        }
        else {
          __range4._3_1_ = false;
          local_dc = 2;
        }
        Data::~Data((Data *)local_d8);
        if (local_dc != 0) break;
        __gnu_cxx::
        __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
        operator++(&__end4);
      }
      local_dd = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"",&local_101);
      Data::Data(__return_storage_ptr__,(string_t *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      Data::setBool(__return_storage_ptr__,__range4._3_1_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data and_func(const vector_t<Data>& args, VM& vm)
{
	if (args.size() == 0) {
		return Data();
	} else if (args.size() == 1) {
		return vm.castTo(args.front(), DT_Bool);
	} else {
		bool b = true;

		for (const Data& d : args) {
			Data e = vm.castTo(d, DT_Bool);
			if (!e.isValid() || !e.getBool()) {
				b = false;
				break;
			}
		}

		Data r;
		r.setBool(b);
		return r;
	}
}